

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

void __thiscall
Assimp::STEP::EXPRESS::ConversionSchema::ConversionSchema<980ul>
          (ConversionSchema *this,SchemaEntry (*schemas) [980])

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->converters)._M_t._M_impl.super__Rb_tree_header;
  (this->converters)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->converters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->converters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->converters)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->converters)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  operator=(this,schemas);
  return;
}

Assistant:

explicit ConversionSchema( const SchemaEntry (& schemas)[N]) {
                *this = schemas;
            }